

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::part_file::export_file
          (part_file *this,function<void_(long,_libtorrent::span<char>)> *f,int64_t offset,
          int64_t size,error_code *ec)

{
  unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
  *this_00;
  int iVar1;
  ulong uVar2;
  iterator iVar3;
  pointer __p;
  int iVar4;
  long lVar5;
  error_code *in_R9;
  long lVar6;
  span<char> buf_00;
  span<char> __args_1;
  piece_index_t piece;
  file_handle file;
  unique_ptr<char[],_std::default_delete<char[]>_> buf;
  unique_lock<std::mutex> l;
  key_type local_80;
  file_handle local_7c;
  _Head_base<0UL,_char_*,_false> local_78;
  error_code *local_70;
  undefined8 local_68;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
  *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  
  local_48 = f;
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&stack0xffffffffffffffa0,&this->m_mutex);
  if ((this->m_piece_map)._M_h._M_element_count != 0) {
    lVar6 = (long)this->m_piece_size;
    uVar2 = offset / lVar6;
    _local_40 = (size + offset + lVar6 + -1) / lVar6;
    local_78._M_head_impl = (char *)0x0;
    local_80.m_val = (uint)uVar2;
    open_file((part_file *)&stack0xffffffffffffff84,(open_mode_t)(uint)this,(error_code *)0x0);
    local_70 = ec;
    if (ec->failed_ == false) {
      this_00 = &this->m_piece_map;
      lVar6 = offset - (int)(uint)uVar2 * lVar6;
      local_50 = &this->m_free_slots;
      local_68 = 0;
      while ((int)uVar2 < (int)local_40) {
        iVar3 = ::std::
                _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_00->_M_h,&local_80);
        lVar5 = this->m_piece_size - lVar6;
        if (size < lVar5) {
          lVar5 = size;
        }
        iVar4 = (int)lVar5;
        if (iVar3.
            super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          iVar1 = *(int *)((long)iVar3.
                                 super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                                 ._M_cur + 0xc);
          local_38 = size;
          if (local_78._M_head_impl == (char *)0x0) {
            __p = (pointer)operator_new__((long)this->m_piece_size);
            ::std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                      ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)
                       &stack0xffffffffffffff88,__p);
          }
          ::std::unique_lock<std::mutex>::unlock
                    ((unique_lock<std::mutex> *)&stack0xffffffffffffffa0);
          buf_00.m_len = lVar6 + this->m_header_size + (long)this->m_piece_size * (long)iVar1;
          buf_00.m_ptr = (char *)(long)iVar4;
          iVar1 = pread_all((aux *)(ulong)(uint)local_7c.m_fd,(handle_type)local_78._M_head_impl,
                            buf_00,(int64_t)local_70,in_R9);
          size = local_38;
          if ((iVar1 == 0) || (local_70->failed_ != false)) break;
          __args_1.m_len = (difference_type)(long)iVar4;
          __args_1.m_ptr = local_78._M_head_impl;
          ::std::function<void_(long,_libtorrent::span<char>)>::operator()
                    ((function<void_(long,_libtorrent::span<char>)> *)local_48,local_68,__args_1);
          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&stack0xffffffffffffffa0);
          if ((this->m_piece_size == iVar4) &&
             (iVar3 = ::std::
                      _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&this_00->_M_h,&local_80),
             iVar3.
             super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
             ._M_cur != (__node_type *)0x0)) {
            ::std::
            vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
            ::push_back(local_50,(value_type *)
                                 ((long)iVar3.
                                        super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                                        ._M_cur + 0xc));
            ::std::
            _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::erase(&this_00->_M_h,
                    (const_iterator)
                    iVar3.
                    super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                    ._M_cur);
            this->m_dirty_metadata = true;
          }
        }
        local_68 = local_68 + (long)iVar4;
        size = size - iVar4;
        local_80.m_val = local_80.m_val + 1;
        lVar6 = 0;
        uVar2 = (ulong)(uint)local_80.m_val;
      }
    }
    file_handle::~file_handle(&stack0xffffffffffffff84);
    ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&stack0xffffffffffffff88);
  }
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stack0xffffffffffffffa0);
  return;
}

Assistant:

void part_file::export_file(std::function<void(std::int64_t, span<char>)> f
		, std::int64_t const offset, std::int64_t size, error_code& ec)
	{
		std::unique_lock<std::mutex> l(m_mutex);

		// there's nothing stored in the part_file. Nothing to do
		if (m_piece_map.empty()) return;

		piece_index_t piece(int(offset / m_piece_size));
		piece_index_t const end = piece_index_t(int(((offset + size) + m_piece_size - 1) / m_piece_size));

		std::unique_ptr<char[]> buf;

		std::int64_t piece_offset = offset - std::int64_t(static_cast<int>(piece))
			* m_piece_size;
		std::int64_t file_offset = 0;
		auto file = open_file(aux::open_mode::read_only, ec);
		if (ec) return;

		for (; piece < end; ++piece)
		{
			auto const i = m_piece_map.find(piece);
			int const block_to_copy = int(std::min(m_piece_size - piece_offset, size));
			if (i != m_piece_map.end())
			{
				slot_index_t const slot = i->second;

				if (!buf) buf.reset(new char[std::size_t(m_piece_size)]);

				// don't hold the lock during disk I/O
				l.unlock();

				span<char> v = {buf.get(), block_to_copy};
				auto bytes_read = aux::pread_all(file.fd(), v, slot_offset(slot) + piece_offset, ec);
				v = v.first(static_cast<std::ptrdiff_t>(bytes_read));
				TORRENT_ASSERT(!ec);
				if (ec || v.empty()) return;

				f(file_offset, {buf.get(), block_to_copy});

				// we're done with the disk I/O, grab the lock again to update
				// the slot map
				l.lock();

				if (block_to_copy == m_piece_size)
				{
					// since we released the lock, it's technically possible that
					// another thread removed this slot map entry, and invalidated
					// our iterator. Now that we hold the lock again, perform
					// another lookup to be sure.
					auto const j = m_piece_map.find(piece);
					if (j != m_piece_map.end())
					{
						// if the slot moved, that's really suspicious
						TORRENT_ASSERT(j->second == slot);
						m_free_slots.push_back(j->second);
						m_piece_map.erase(j);
						m_dirty_metadata = true;
					}
				}
			}
			file_offset += block_to_copy;
			piece_offset = 0;
			size -= block_to_copy;
		}
	}